

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
getIterationDescription_abi_cxx11_(string *__return_storage_ptr__,void *this,int iteration)

{
  allocator<char> local_76;
  allocator<char> local_75;
  int local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_1d;
  int local_1c;
  void *pvStack_18;
  int iteration_local;
  InterpolateAtSampleRenderCase *this_local;
  
  local_1c = iteration;
  pvStack_18 = this;
  this_local = (InterpolateAtSampleRenderCase *)__return_storage_ptr__;
  if (iteration == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with float varying",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else if (iteration < 4) {
    local_74 = iteration + 1;
    de::toString<int>(&local_70,&local_74);
    std::operator+(&local_50,"Test with vec",&local_70);
    std::operator+(__return_storage_ptr__,&local_50," varying");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else if (iteration == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Test with array varying",&local_75);
    std::allocator<char>::~allocator(&local_75);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_76);
    std::allocator<char>::~allocator(&local_76);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::getIterationDescription (int iteration) const
{
	if (iteration == 0)
		return "Test with float varying";
	else if (iteration < 4)
		return "Test with vec" + de::toString(iteration+1) + " varying";
	else if (iteration == 4)
		return "Test with array varying";

	DE_ASSERT(false);
	return "";
}